

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O0

void __thiscall t_rs_generator::~t_rs_generator(t_rs_generator *this)

{
  t_rs_generator *this_local;
  
  ~t_rs_generator(this);
  operator_delete(this);
  return;
}

Assistant:

t_rs_generator(
    t_program* program,
    const std::map<std::string, std::string>&,
    const std::string&
  ) : t_generator(program) {
    gen_dir_ = get_out_dir();
  }